

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

bool glcts::verifyFace<unsigned_int,4u,3u,3u>
               (uint *data,GLuint cube_face,uint *expected_values,GLuint image_width)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  GLuint y;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  GLuint x;
  long lVar8;
  long lVar9;
  
  uVar3 = cube_face * 0xc;
  uVar4 = cube_face * 0x24;
  for (uVar5 = 0; uVar5 != 3; uVar5 = uVar5 + 1) {
    lVar8 = 0;
    uVar6 = uVar3;
    uVar7 = uVar4;
    while( true ) {
      if (lVar8 == 3) break;
      lVar9 = 0;
      while (lVar9 != 4) {
        lVar1 = (ulong)uVar6 + lVar9;
        lVar2 = (ulong)uVar7 + lVar9;
        lVar9 = lVar9 + 1;
        if (data[lVar1] != expected_values[lVar2]) goto LAB_00d45417;
      }
      lVar8 = lVar8 + 1;
      uVar7 = uVar7 + 4;
      uVar6 = uVar6 + 4;
    }
    uVar4 = uVar4 + 0xc;
    uVar3 = uVar3 + image_width * 4;
  }
LAB_00d45417:
  return 2 < uVar5;
}

Assistant:

bool verifyFace(const T* data, const glw::GLuint cube_face, const T* expected_values, const glw::GLuint image_width)
{
	static const glw::GLuint size_of_pixel = N_Components;

	const glw::GLuint data_face_offset  = N_Components * Width * cube_face;
	const glw::GLuint exp_face_offset   = N_Components * Width * Height * cube_face;
	const glw::GLuint data_size_of_line = image_width * size_of_pixel;
	const glw::GLuint exp_size_of_line  = Width * size_of_pixel;

	for (glw::GLuint y = 0; y < Height; ++y)
	{
		const glw::GLuint data_line_offset = y * data_size_of_line;
		const glw::GLuint exp_line_offset  = y * exp_size_of_line;

		for (glw::GLuint x = 0; x < Width; ++x)
		{
			const glw::GLuint data_pixel_offset = data_line_offset + data_face_offset + x * size_of_pixel;
			const glw::GLuint exp_pixel_offset  = exp_line_offset + exp_face_offset + x * size_of_pixel;

			for (glw::GLuint component = 0; component < N_Components; ++component)
			{
				if (data[data_pixel_offset + component] != expected_values[exp_pixel_offset + component])
				{
					return false;
				}
			}
		}
	}

	return true;
}